

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrettyPrinter.cpp
# Opt level: O0

void __thiscall hdc::PrettyPrinter::visit(PrettyPrinter *this,LogicalOrExpression *expression)

{
  TokenKind TVar1;
  Expression *pEVar2;
  Token local_48;
  BinaryOperator *local_18;
  LogicalOrExpression *expression_local;
  PrettyPrinter *this_local;
  
  local_18 = &expression->super_BinaryOperator;
  expression_local = (LogicalOrExpression *)this;
  pEVar2 = BinaryOperator::getLeft(&expression->super_BinaryOperator);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  BinaryOperator::getOper(&local_48,local_18);
  TVar1 = Token::getKind(&local_48);
  Token::~Token(&local_48);
  if (TVar1 == TK_OR) {
    std::operator<<((ostream *)&this->field_0x20," or ");
  }
  else {
    std::operator<<((ostream *)&this->field_0x20," || ");
  }
  pEVar2 = BinaryOperator::getRight(local_18);
  (**(pEVar2->super_Statement).super_ASTNode._vptr_ASTNode)(pEVar2,this);
  return;
}

Assistant:

void PrettyPrinter::visit(LogicalOrExpression *expression) {
    expression->getLeft()->accept(this);

    if (expression->getOper().getKind() == TK_OR) {
        output << " or ";
    } else {
        output << " || ";
    }

    expression->getRight()->accept(this);
}